

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
          (ImageTemplate<unsigned_char> *this,ImageTemplate<unsigned_char> *image)

{
  ImageTemplate<unsigned_char> *in_RSI;
  undefined8 *in_RDI;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__ImageTemplate_0029e8f0;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)(in_RDI + 2) = 1;
  *(undefined1 *)((long)in_RDI + 0x11) = 1;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  in_RDI[3] = 0;
  *(undefined1 *)(in_RDI + 4) = 0;
  swap(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ImageTemplate( ImageTemplate && image )
            : _width     ( 0 )
            , _height    ( 0 )
            , _colorCount( 1 )
            , _alignment ( 1 )
            , _rowSize   ( 0 )
            , _data      ( nullptr )
            , _type      ( 0 )
        {
            swap( image );
        }